

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

CURLcode start_req(h1_req_parser *parser,char *scheme_default,int options)

{
  char *__s2;
  int iVar1;
  CURLUcode CVar2;
  char *pcVar3;
  CURLU *__n;
  size_t sVar4;
  uint local_20ac;
  char local_20a8 [4];
  uint url_options;
  char tmp [8192];
  CURLcode local_9c;
  CURLUcode uc;
  CURLcode result;
  CURLU *url;
  size_t i;
  size_t path_len;
  size_t authority_len;
  size_t scheme_len;
  size_t hv_len;
  size_t target_len;
  size_t m_len;
  char *path;
  char *authority;
  char *scheme;
  char *hv;
  char *target;
  char *m;
  char *p;
  int options_local;
  char *scheme_default_local;
  h1_req_parser *parser_local;
  
  _uc = (CURLU *)0x0;
  local_9c = CURLE_URL_MALFORMAT;
  pcVar3 = (char *)memchr(parser->line,0x20,parser->line_len);
  if ((pcVar3 != (char *)0x0) && (pcVar3 != parser->line)) {
    __s2 = parser->line;
    __n = (CURLU *)(pcVar3 + -(long)parser->line);
    pcVar3 = pcVar3 + 1;
    scheme_len = 0;
    hv_len = 0;
    for (url = (CURLU *)parser->line_len; __n < url; url = (CURLU *)&url[-1].field_0x57) {
      if (parser->line[(long)url] == ' ') {
        scheme_len = parser->line_len - (long)url;
        hv_len = (long)(parser->line + (long)url) - (long)pcVar3;
        break;
      }
    }
    if ((hv_len != 0) && (scheme_len != 0)) {
      m_len = 0;
      path = (char *)0x0;
      authority = (char *)0x0;
      i = 0;
      path_len = 0;
      authority_len = 0;
      if ((hv_len == 1) && (*pcVar3 == '*')) {
        i = hv_len;
        m_len = (size_t)pcVar3;
      }
      else {
        iVar1 = strncmp("CONNECT",__s2,(size_t)__n);
        if (iVar1 == 0) {
          path_len = hv_len;
          path = pcVar3;
        }
        else {
          if (*pcVar3 != '/') {
            if (0x1fff < hv_len) goto LAB_001580a4;
            memcpy(local_20a8,pcVar3,hv_len);
            local_20a8[hv_len] = '\0';
            sVar4 = Curl_is_absolute_url(local_20a8,(char *)0x0,0,false);
            if (sVar4 != 0) {
              _uc = curl_url();
              if (_uc == (CURLU *)0x0) {
                local_9c = CURLE_OUT_OF_MEMORY;
                goto LAB_001580a4;
              }
              local_20ac = 0x1a;
              if ((options & 1U) == 0) {
                local_20ac = 0x81a;
              }
              CVar2 = curl_url_set(_uc,CURLUPART_URL,local_20a8,local_20ac);
              if (CVar2 != CURLUE_OK) goto LAB_001580a4;
            }
            if ((_uc == (CURLU *)0x0) && ((options & 1U) != 0)) goto LAB_001580a4;
          }
          i = hv_len;
          m_len = (size_t)pcVar3;
        }
      }
      if (_uc == (CURLU *)0x0) {
        if (scheme_default != (char *)0x0) {
          authority_len = strlen(scheme_default);
          authority = scheme_default;
        }
        local_9c = Curl_http_req_make(&parser->req,__s2,(size_t)__n,authority,authority_len,path,
                                      path_len,(char *)m_len,i);
      }
      else {
        local_9c = Curl_http_req_make2(&parser->req,__s2,(size_t)__n,_uc,scheme_default);
      }
    }
  }
LAB_001580a4:
  curl_url_cleanup(_uc);
  return local_9c;
}

Assistant:

static CURLcode start_req(struct h1_req_parser *parser,
                          const char *scheme_default, int options)
{
  const char  *p, *m, *target, *hv, *scheme, *authority, *path;
  size_t m_len, target_len, hv_len, scheme_len, authority_len, path_len;
  size_t i;
  CURLU *url = NULL;
  CURLcode result = CURLE_URL_MALFORMAT; /* Use this as default fail */

  DEBUGASSERT(!parser->req);
  /* line must match: "METHOD TARGET HTTP_VERSION" */
  p = memchr(parser->line, ' ', parser->line_len);
  if(!p || p == parser->line)
    goto out;

  m = parser->line;
  m_len = p - parser->line;
  target = p + 1;
  target_len = hv_len = 0;
  hv = NULL;

  /* URL may contain spaces so scan backwards */
  for(i = parser->line_len; i > m_len; --i) {
    if(parser->line[i] == ' ') {
      hv = &parser->line[i + 1];
      hv_len = parser->line_len - i;
      target_len = (hv - target) - 1;
      break;
    }
  }
  /* no SPACE found or empty TARGET or empty HTTP_VERSION */
  if(!target_len || !hv_len)
    goto out;

  (void)hv;

  /* The TARGET can be (rfc 9112, ch. 3.2):
   * origin-form:     path + optional query
   * absolute-form:   absolute URI
   * authority-form:  host+port for CONNECT
   * asterisk-form:   '*' for OPTIONS
   *
   * from TARGET, we derive `scheme` `authority` `path`
   * origin-form            --        --          TARGET
   * absolute-form          URL*      URL*        URL*
   * authority-form         --        TARGET      --
   * asterisk-form          --        --          TARGET
   */
  scheme = authority = path = NULL;
  scheme_len = authority_len = path_len = 0;

  if(target_len == 1 && target[0] == '*') {
    /* asterisk-form */
    path = target;
    path_len = target_len;
  }
  else if(!strncmp("CONNECT", m, m_len)) {
    /* authority-form */
    authority = target;
    authority_len = target_len;
  }
  else if(target[0] == '/') {
    /* origin-form */
    path = target;
    path_len = target_len;
  }
  else {
    /* origin-form OR absolute-form */
    CURLUcode uc;
    char tmp[H1_MAX_URL_LEN];

    /* default, unless we see an absolute URL */
    path = target;
    path_len = target_len;

    /* URL parser wants 0-termination */
    if(target_len >= sizeof(tmp))
      goto out;
    memcpy(tmp, target, target_len);
    tmp[target_len] = '\0';
    /* See if treating TARGET as an absolute URL makes sense */
    if(Curl_is_absolute_url(tmp, NULL, 0, FALSE)) {
      unsigned int url_options;

      url = curl_url();
      if(!url) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      url_options = (CURLU_NON_SUPPORT_SCHEME|
                     CURLU_PATH_AS_IS|
                     CURLU_NO_DEFAULT_PORT);
      if(!(options & H1_PARSE_OPT_STRICT))
        url_options |= CURLU_ALLOW_SPACE;
      uc = curl_url_set(url, CURLUPART_URL, tmp, url_options);
      if(uc) {
        goto out;
      }
    }

    if(!url && (options & H1_PARSE_OPT_STRICT)) {
      /* we should have an absolute URL or have seen `/` earlier */
      goto out;
    }
  }

  if(url) {
    result = Curl_http_req_make2(&parser->req, m, m_len, url, scheme_default);
  }
  else {
    if(!scheme && scheme_default) {
      scheme = scheme_default;
      scheme_len = strlen(scheme_default);
    }
    result = Curl_http_req_make(&parser->req, m, m_len, scheme, scheme_len,
                                authority, authority_len, path, path_len);
  }

out:
  curl_url_cleanup(url);
  return result;
}